

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckLimits
          (SharedValidator *this,Location *loc,Limits *limits,uint64_t absolute_max,char *desc)

{
  Result RVar1;
  Enum EVar2;
  ulong uVar3;
  
  EVar2 = Ok;
  if (absolute_max < limits->initial) {
    RVar1 = PrintError(this,loc,"initial %s (%lu) must be <= (%lu)",desc,limits->initial,
                       absolute_max);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  if (limits->has_max == true) {
    uVar3 = limits->max;
    if (absolute_max < uVar3) {
      RVar1 = PrintError(this,loc,"max %s (%lu) must be <= (%lu)",desc,uVar3,absolute_max);
      EVar2 = (Enum)(byte)(RVar1.enum_ == Error | (byte)EVar2);
      uVar3 = limits->max;
    }
    if (uVar3 < limits->initial) {
      RVar1 = PrintError(this,loc,"max %s (%lu) must be >= initial %s (%lu)",desc,uVar3,desc,
                         limits->initial);
      EVar2 = (Enum)(byte)(RVar1.enum_ == Error | (byte)EVar2);
    }
  }
  return (Result)EVar2;
}

Assistant:

Result SharedValidator::CheckLimits(const Location& loc,
                                    const Limits& limits,
                                    uint64_t absolute_max,
                                    const char* desc) {
  Result result = Result::Ok;
  if (limits.initial > absolute_max) {
    result |=
        PrintError(loc, "initial %s (%" PRIu64 ") must be <= (%" PRIu64 ")",
                   desc, limits.initial, absolute_max);
  }

  if (limits.has_max) {
    if (limits.max > absolute_max) {
      result |= PrintError(loc, "max %s (%" PRIu64 ") must be <= (%" PRIu64 ")",
                           desc, limits.max, absolute_max);
    }

    if (limits.max < limits.initial) {
      result |= PrintError(
          loc, "max %s (%" PRIu64 ") must be >= initial %s (%" PRIu64 ")", desc,
          limits.max, desc, limits.initial);
    }
  }
  return result;
}